

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O0

MultiFab * __thiscall
amrex::MultiCutFab::ToMultiFab(MultiCutFab *this,Real regular_value,Real covered_value)

{
  bool bVar1;
  BoxArray *bxs;
  MultiFab *this_00;
  EBCellFlagFab *this_01;
  MFInfo *in_RSI;
  MFIter *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  FabArray<amrex::CutFab> *in_XMM1_Qa;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Real val;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *s;
  Array4<double> *d;
  Box *b;
  FabType t;
  MFIter mfi;
  int ncomp;
  MultiFab *mf;
  FabArrayBase *mfi_00;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffffbd0;
  FabFactory<amrex::FArrayBox> in_stack_fffffffffffffbd8;
  MFIter *in_stack_fffffffffffffbe0;
  uchar flags_;
  FabArrayBase *fabarray_;
  MFIter *this_02;
  FabFactory<amrex::FArrayBox> *factory;
  int local_3d8;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  int local_380;
  uint local_37c;
  int local_378;
  int local_374;
  MFIter local_330;
  long local_2d0;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_29c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  FabType local_274;
  MFIter local_270;
  undefined1 local_200 [8];
  FabFactory<amrex::FArrayBox> local_1f8 [10];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  _Atomic_word local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  int local_18c;
  int iStack_188;
  _Atomic_word local_184;
  _func_int **local_180;
  _Atomic_word local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  int local_164;
  uint uStack_160;
  _Atomic_word local_15c;
  _Bit_type *local_158;
  uint local_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  int local_13c;
  int iStack_138;
  uint local_134;
  RefID local_130;
  int local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  int local_114;
  int iStack_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_f8;
  int local_f0;
  int local_ec;
  uint local_e8;
  int local_e4;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_e0;
  int local_d8;
  int local_d4;
  uint local_d0;
  int local_cc;
  MFIter *local_c8;
  undefined4 local_bc;
  _Atomic_word *local_b8;
  undefined4 local_ac;
  _Atomic_word *local_a8;
  undefined4 local_9c;
  _Atomic_word *local_98;
  undefined4 local_8c;
  _Atomic_word *local_88;
  undefined4 local_7c;
  _Atomic_word *local_78;
  undefined4 local_6c;
  _Atomic_word *local_68;
  undefined4 local_5c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined4 local_4c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined4 local_3c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined4 local_2c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  undefined4 local_1c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  undefined4 local_c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_8;
  
  local_1f8[7]._vptr_FabFactory = (_func_int **)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  this_02 = in_RDI;
  local_1f8[6]._vptr_FabFactory = (_func_int **)in_XMM1_Qa;
  local_1f8[5]._vptr_FabFactory._4_4_ = nComp((MultiCutFab *)0x117cb68);
  local_1f8[5]._vptr_FabFactory._3_1_ = 0;
  bxs = boxArray((MultiCutFab *)0x117cb81);
  this_00 = (MultiFab *)DistributionMap((MultiCutFab *)0x117cb90);
  nGrow((MultiCutFab *)0x117cbaa);
  local_1f8[2]._vptr_FabFactory = (_func_int **)0x0;
  local_1f8[3]._vptr_FabFactory = (_func_int **)0x0;
  local_1f8[0]._vptr_FabFactory = (_func_int **)0x0;
  local_1f8[1]._vptr_FabFactory = (_func_int **)0x0;
  local_1f8[4]._vptr_FabFactory = (_func_int **)0x0;
  factory = local_1f8;
  MFInfo::MFInfo((MFInfo *)0x117cbdf);
  local_200 = (undefined1  [8])0x0;
  mfi_00 = (FabArrayBase *)local_200;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffbd0);
  fabarray_ = mfi_00;
  MultiFab::MultiFab(this_00,bxs,(DistributionMapping *)this_02,(int)((ulong)mfi_00 >> 0x20),
                     (int)mfi_00,in_RSI,factory);
  flags_ = (uchar)((ulong)in_RSI >> 0x38);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x117cc39);
  MFInfo::~MFInfo((MFInfo *)0x117cc46);
  MFIter::MFIter(this_02,fabarray_,flags_);
  while (bVar1 = MFIter::isValid(&local_270), bVar1) {
    this_01 = FabArray<amrex::EBCellFlagFab>::operator[](in_stack_fffffffffffffbd0,(MFIter *)mfi_00)
    ;
    local_274 = EBCellFlagFab::getType(this_01);
    MFIter::fabbox(in_stack_fffffffffffffbe0);
    local_280 = &local_29c;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffbd8._vptr_FabFactory,
               (MFIter *)in_stack_fffffffffffffbd0);
    local_2a8 = &local_330.tile_array;
    if (local_274 == singlevalued) {
      in_stack_fffffffffffffbe0 = &local_330;
      FabArray<amrex::CutFab>::const_array<amrex::CutFab,_0>
                ((FabArray<amrex::CutFab> *)in_stack_fffffffffffffbd8._vptr_FabFactory,
                 (MFIter *)in_stack_fffffffffffffbd0);
      local_170 = local_280;
      local_38 = local_280;
      local_3c = 0;
      local_164 = *(int *)&local_280->_vptr__Sp_counted_base;
      local_48 = local_280;
      local_4c = 1;
      uStack_160 = *(uint *)((long)&local_280->_vptr__Sp_counted_base + 4);
      local_180 = local_280->_vptr__Sp_counted_base;
      local_58 = local_280;
      local_5c = 2;
      local_178 = local_280->_M_use_count;
      local_120 = local_280;
      local_98 = &local_280->_M_weak_count;
      local_9c = 0;
      local_114 = *local_98;
      local_a8 = &local_280->_M_weak_count;
      local_ac = 1;
      iStack_110 = *(int *)&local_280[1]._vptr__Sp_counted_base;
      local_130.data = *(BARef **)local_98;
      local_b8 = &local_280->_M_weak_count;
      local_bc = 2;
      local_128 = *(int *)((long)&local_280[1]._vptr__Sp_counted_base + 4);
      for (local_374 = 0; local_378 = local_178,
          local_330.local_index_map = (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbe0
          , local_15c = local_178, local_10c = local_128,
          local_374 < (int)local_1f8[5]._vptr_FabFactory._4_4_; local_374 = local_374 + 1) {
        for (; local_37c = uStack_160, local_378 <= local_128; local_378 = local_378 + 1) {
          for (; local_380 = local_164, (int)local_37c <= iStack_110; local_37c = local_37c + 1) {
            for (; local_380 <= local_114; local_380 = local_380 + 1) {
              local_cc = local_380;
              local_d0 = local_37c;
              local_d4 = local_378;
              local_d8 = local_374;
              local_e0 = local_2a8;
              local_e4 = local_380;
              local_e8 = local_37c;
              local_ec = local_378;
              local_f0 = local_374;
              (&((*local_2a8)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start)
              [(long)(local_380 - (int)local_2a8[4]) +
               (long)(int)(local_37c - *(int *)((long)local_2a8 + 0x24)) * (long)local_2a8[1] +
               (long)(local_378 - (int)local_2a8[5]) * (long)local_2a8[2] +
               (long)local_374 * (long)local_2a8[3]] =
                   *(pointer *)
                    ((long)&((in_stack_fffffffffffffbe0->m_fa)._M_t.
                             super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                            _vptr_FabArrayBase +
                    ((long)(local_380 - in_stack_fffffffffffffbe0->currentIndex) +
                     (long)(int)(local_37c - in_stack_fffffffffffffbe0->beginIndex) *
                     (long)in_stack_fffffffffffffbe0->fabArray +
                     (long)(local_378 - in_stack_fffffffffffffbe0->endIndex) *
                     *(long *)(in_stack_fffffffffffffbe0->tile_size).vect +
                    (long)local_374 * *(long *)((in_stack_fffffffffffffbe0->tile_size).vect + 2)) *
                    8);
              local_c8 = in_stack_fffffffffffffbe0;
            }
          }
        }
      }
    }
    else {
      in_stack_fffffffffffffbd8._vptr_FabFactory = local_1f8[6]._vptr_FabFactory;
      if (local_274 == regular) {
        in_stack_fffffffffffffbd8._vptr_FabFactory = local_1f8[7]._vptr_FabFactory;
      }
      local_198._M_pi = local_280;
      local_8 = local_280;
      local_c = 0;
      local_18c = *(int *)&local_280->_vptr__Sp_counted_base;
      local_18 = local_280;
      local_1c = 1;
      iStack_188 = *(int *)((long)&local_280->_vptr__Sp_counted_base + 4);
      local_1a8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280->_vptr__Sp_counted_base;
      local_28 = local_280;
      local_2c = 2;
      local_1a0 = local_280->_M_use_count;
      local_148 = local_280;
      local_68 = &local_280->_M_weak_count;
      local_6c = 0;
      local_13c = *local_68;
      local_78 = &local_280->_M_weak_count;
      local_7c = 1;
      iStack_138 = *(int *)&local_280[1]._vptr__Sp_counted_base;
      local_158 = *(_Bit_type **)local_68;
      local_88 = &local_280->_M_weak_count;
      local_8c = 2;
      local_150 = *(uint *)((long)&local_280[1]._vptr__Sp_counted_base + 4);
      for (local_3cc = 0; local_3d0 = local_1a0, local_184 = local_1a0, local_134 = local_150,
          local_3cc < (int)local_1f8[5]._vptr_FabFactory._4_4_; local_3cc = local_3cc + 1) {
        for (; local_3d4 = iStack_188, local_3d0 <= (int)local_150; local_3d0 = local_3d0 + 1) {
          for (; local_3d8 = local_18c, local_3d4 <= iStack_138; local_3d4 = local_3d4 + 1) {
            for (; local_3d8 <= local_13c; local_3d8 = local_3d8 + 1) {
              local_fc = local_3d8;
              local_100 = local_3d4;
              local_104 = local_3d0;
              local_108 = local_3cc;
              (&((local_330.tile_array)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start)
              [(long)(local_3d8 - local_2c8) +
               (long)(local_3d4 - local_2c4) * (long)local_330.local_tile_index_map +
               (long)(local_3d0 - local_2c0) * (long)local_330.num_local_tiles +
               local_3cc * local_2d0] = (pointer)in_stack_fffffffffffffbd8._vptr_FabFactory;
              local_f8 = local_2a8;
            }
          }
        }
      }
    }
    MFIter::operator++(&local_270);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffbd0);
  return (MultiFab *)in_RDI;
}

Assistant:

MultiFab
MultiCutFab::ToMultiFab (Real regular_value, Real covered_value) const
{
    const int ncomp = nComp();
    MultiFab mf(boxArray(), DistributionMap(), ncomp, nGrow());
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        auto t = (*m_cellflags)[mfi].getType();
        Box const& b = mfi.fabbox();
        Array4<Real> const& d = mf.array(mfi);
        if (t == FabType::singlevalued) {
            Array4<Real const> const& s = m_data.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(b, ncomp, i, j, k, n,
            {
                d(i,j,k,n) = s(i,j,k,n);
            });
        } else {
            Real val = (t == FabType::regular) ? regular_value : covered_value;
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(b, ncomp, i, j, k, n,
            {
                d(i,j,k,n) = val;
            });
        }
    }
    return mf;
}